

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_parser::parse_doctype_group(xml_parser *this,char_t *s,char_t endch)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  if (((*s != '<') && (*s != '\0')) || (s[1] != '!')) {
    __assert_fail("(s[0] == \'<\' || s[0] == 0) && s[1] == \'!\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0xbda,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_group(char_t *, char_t)"
                 );
  }
  lVar3 = 0;
  pbVar6 = (byte *)(s + 2);
LAB_0019e181:
  do {
    bVar1 = *pbVar6;
    if (bVar1 < 0x27) {
      if (bVar1 != 0x22) {
        if (bVar1 == 0) {
          if (endch != '>' || lVar3 != 0) {
            this->error_offset = (char_t *)pbVar6;
            this->error_status = status_bad_doctype;
            return (char_t *)0x0;
          }
          return (char_t *)pbVar6;
        }
LAB_0019e29d:
        pbVar6 = pbVar6 + 1;
        goto LAB_0019e181;
      }
LAB_0019e235:
      pbVar5 = pbVar6 + 1;
      do {
        pbVar6 = pbVar5;
        bVar2 = *pbVar6;
        pbVar5 = pbVar6 + 1;
        if (bVar2 == 0) break;
      } while (bVar2 != bVar1);
      if (bVar2 == 0) goto LAB_0019e2a9;
    }
    else {
      if (bVar1 == 0x27) goto LAB_0019e235;
      if (bVar1 != 0x3c) {
        if (bVar1 == 0x3e) {
          if (lVar3 == 0) {
            return (char_t *)pbVar6;
          }
          lVar3 = lVar3 + -1;
        }
        goto LAB_0019e29d;
      }
      if ((pbVar6[1] == 0x21) && (pbVar6[2] != 0x2d)) {
        if (pbVar6[2] == 0x5b) {
          pbVar5 = pbVar6 + 3;
          lVar4 = 0;
LAB_0019e1db:
          pbVar5 = pbVar5 + 3;
          do {
            bVar1 = pbVar5[-3];
            if (bVar1 == 0x3c) {
              if ((pbVar5[-2] == 0x21) && (pbVar5[-1] == 0x5b)) {
                lVar4 = lVar4 + 1;
                goto LAB_0019e1db;
              }
            }
            else if (bVar1 == 0x5d) {
              if ((pbVar5[-2] == 0x5d) && (pbVar5[-1] == 0x3e)) goto LAB_0019e21d;
            }
            else if (bVar1 == 0) {
              pbVar6 = pbVar5 + -3;
              goto LAB_0019e2a9;
            }
            pbVar5 = pbVar5 + 1;
          } while( true );
        }
        pbVar6 = pbVar6 + 2;
        lVar3 = lVar3 + 1;
        goto LAB_0019e181;
      }
      if (pbVar6[1] == 0x3f) {
        pbVar6 = pbVar6 + 2;
        do {
          if (*pbVar6 == 0x3f) {
            if (pbVar6[1] == 0x3e) {
              pbVar5 = pbVar6 + 2;
              goto LAB_0019e2b6;
            }
          }
          else if (*pbVar6 == 0) goto LAB_0019e2a9;
          pbVar6 = pbVar6 + 1;
        } while( true );
      }
      if (((pbVar6[1] == 0x21) && (pbVar6[2] == 0x2d)) && (pbVar6[3] == 0x2d)) {
        pbVar6 = pbVar6 + 4;
        do {
          if (*pbVar6 == 0x2d) {
            if ((pbVar6[1] == 0x2d) && (pbVar6[2] == 0x3e)) {
              pbVar5 = pbVar6 + 3;
              goto LAB_0019e2b6;
            }
          }
          else if (*pbVar6 == 0) break;
          pbVar6 = pbVar6 + 1;
        } while( true );
      }
LAB_0019e2a9:
      this->error_offset = (char_t *)pbVar6;
      this->error_status = status_bad_doctype;
      pbVar5 = (byte *)0x0;
    }
LAB_0019e2b6:
    pbVar6 = pbVar5;
    if (pbVar5 == (byte *)0x0) {
      return (char_t *)0x0;
    }
  } while( true );
LAB_0019e21d:
  if (lVar4 != 0) {
    lVar4 = lVar4 + -1;
    goto LAB_0019e1db;
  }
  goto LAB_0019e2b6;
}

Assistant:

char_t* parse_doctype_group(char_t* s, char_t endch)
		{
			size_t depth = 0;

			assert((s[0] == '<' || s[0] == 0) && s[1] == '!');
			s += 2;

			while (*s)
			{
				if (s[0] == '<' && s[1] == '!' && s[2] != '-')
				{
					if (s[2] == '[')
					{
						// ignore
						s = parse_doctype_ignore(s);
						if (!s) return s;
					}
					else
					{
						// some control group
						s += 2;
						depth++;
					}
				}
				else if (s[0] == '<' || s[0] == '"' || s[0] == '\'')
				{
					// unknown tag (forbidden), or some primitive group
					s = parse_doctype_primitive(s);
					if (!s) return s;
				}
				else if (*s == '>')
				{
					if (depth == 0)
						return s;

					depth--;
					s++;
				}
				else s++;
			}

			if (depth != 0 || endch != '>') PUGI_IMPL_THROW_ERROR(status_bad_doctype, s);

			return s;
		}